

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cpp
# Opt level: O3

void __thiscall embree::Device::execute(Device *this,bool join,function<void_()> *func)

{
  __uniq_ptr_impl<tbb::detail::d1::task_arena,_std::default_delete<tbb::detail::d1::task_arena>_>
  _Var1;
  undefined8 *puVar2;
  undefined8 extraout_RDX;
  int iVar3;
  undefined7 in_register_00000031;
  undefined1 *puStack_60;
  long lStack_58;
  undefined1 auStack_50 [16];
  unique_ptr<tbb::detail::d1::task_arena,_std::default_delete<tbb::detail::d1::task_arena>_>
  local_28;
  function<void_()> *local_20;
  
  iVar3 = (int)CONCAT71(in_register_00000031,join);
  if (iVar3 != 0) {
    _Var1._M_t.
    super__Tuple_impl<0UL,_tbb::detail::d1::task_arena_*,_std::default_delete<tbb::detail::d1::task_arena>_>
    .super__Head_base<0UL,_tbb::detail::d1::task_arena_*,_false>._M_head_impl =
         *(tuple<tbb::detail::d1::task_arena_*,_std::default_delete<tbb::detail::d1::task_arena>_> *
          )&(((this->arena)._M_t.
              super___uniq_ptr_impl<embree::TaskArena,_std::default_delete<embree::TaskArena>_>._M_t
              .super__Tuple_impl<0UL,_embree::TaskArena_*,_std::default_delete<embree::TaskArena>_>.
              super__Head_base<0UL,_embree::TaskArena_*,_false>._M_head_impl)->arena)._M_t;
    local_28._M_t.
    super___uniq_ptr_impl<tbb::detail::d1::task_arena,_std::default_delete<tbb::detail::d1::task_arena>_>
    ._M_t.
    super__Tuple_impl<0UL,_tbb::detail::d1::task_arena_*,_std::default_delete<tbb::detail::d1::task_arena>_>
    .super__Head_base<0UL,_tbb::detail::d1::task_arena_*,_false>._M_head_impl =
         (__uniq_ptr_data<tbb::detail::d1::task_arena,_std::default_delete<tbb::detail::d1::task_arena>,_true,_true>
          )(__uniq_ptr_data<tbb::detail::d1::task_arena,_std::default_delete<tbb::detail::d1::task_arena>,_true,_true>
            )_Var1._M_t.
             super__Tuple_impl<0UL,_tbb::detail::d1::task_arena_*,_std::default_delete<tbb::detail::d1::task_arena>_>
             .super__Head_base<0UL,_tbb::detail::d1::task_arena_*,_false>._M_head_impl;
    tbb::detail::d0::atomic_do_once<tbb::detail::d1::task_arena::initialize()::_lambda()_1_>
              ((anon_class_8_1_8991fb9c *)&local_28,
               (atomic<tbb::detail::d0::do_once_state> *)
               ((long)_Var1._M_t.
                      super__Tuple_impl<0UL,_tbb::detail::d1::task_arena_*,_std::default_delete<tbb::detail::d1::task_arena>_>
                      .super__Head_base<0UL,_tbb::detail::d1::task_arena_*,_false>._M_head_impl + 8)
              );
    local_28._M_t.
    super___uniq_ptr_impl<tbb::detail::d1::task_arena,_std::default_delete<tbb::detail::d1::task_arena>_>
    ._M_t.
    super__Tuple_impl<0UL,_tbb::detail::d1::task_arena_*,_std::default_delete<tbb::detail::d1::task_arena>_>
    .super__Head_base<0UL,_tbb::detail::d1::task_arena_*,_false>._M_head_impl =
         (__uniq_ptr_data<tbb::detail::d1::task_arena,_std::default_delete<tbb::detail::d1::task_arena>,_true,_true>
          )&PTR_operator___02184a40;
    local_20 = func;
    tbb::detail::r1::execute
              ((task_arena_base *)
               _Var1._M_t.
               super__Tuple_impl<0UL,_tbb::detail::d1::task_arena_*,_std::default_delete<tbb::detail::d1::task_arena>_>
               .super__Head_base<0UL,_tbb::detail::d1::task_arena_*,_false>._M_head_impl,
               (delegate_base *)&local_28);
    return;
  }
  if ((func->super__Function_base)._M_manager != (_Manager_type)0x0) {
    (*func->_M_invoker)((_Any_data *)func);
    return;
  }
  std::__throw_bad_function_call();
  if (iVar3 - 1000000U < 4) {
    *(undefined8 *)(&PTR_debug_int0_021849b0)[iVar3 - 1000000U] = extraout_RDX;
    return;
  }
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x30);
  puStack_60 = auStack_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&puStack_60,"unknown writable property","");
  *puVar2 = &PTR__rtcore_error_02184a18;
  *(undefined4 *)(puVar2 + 1) = 2;
  puVar2[2] = puVar2 + 4;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(puVar2 + 2),puStack_60,puStack_60 + lStack_58);
  __cxa_throw(puVar2,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

void Device::execute(bool join, const std::function<void()>& func)
  {
#if USE_TASK_ARENA
    if (join) {
      arena->arena->execute(func);
    }
    else
#endif
    {
      func();
    }
  }